

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_trie.c
# Opt level: O1

int main(void)

{
  _Bool _Var1;
  trie_node *ptVar2;
  long in_FS_OFFSET;
  _Bool found;
  uint lvl;
  lrtr_ip_addr addr;
  _Bool local_14d;
  uint local_14c;
  trie_node local_148;
  trie_node local_108;
  trie_node local_c8;
  trie_node local_88;
  lrtr_ip_addr local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_14c = 0;
  local_48._0_8_ = local_48._0_8_ & 0xffffffff00000000;
  local_88.len = '\x10';
  local_88.rchild = (trie_node *)0x0;
  local_88.lchild = (trie_node *)0x0;
  local_88.parent = (trie_node *)0x0;
  local_88.data = (void *)0x0;
  lrtr_ip_str_to_addr("100.200.0.0",&local_88.prefix);
  local_48._0_8_ = local_88.prefix._0_8_;
  local_48.u._4_8_ = local_88.prefix.u._4_8_;
  local_48.u.addr6.addr[3] = local_88.prefix.u.addr6.addr[3];
  ptVar2 = trie_lookup(&local_88,&local_48,'\x10',&local_14c);
  if (ptVar2 == (trie_node *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x2f,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&ptVar2->prefix,"100.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&result->prefix, \"100.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x30,"void trie_test(void)");
  }
  lrtr_ip_str_to_addr("100.200.30.0",&local_48);
  ptVar2 = trie_lookup(&local_88,&local_48,'\x10',&local_14c);
  if (ptVar2 == (trie_node *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x34,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&ptVar2->prefix,"100.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&result->prefix, \"100.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x35,"void trie_test(void)");
  }
  local_c8.len = '\x10';
  local_c8.rchild = (trie_node *)0x0;
  local_c8.lchild = (trie_node *)0x0;
  local_c8.parent = (trie_node *)0x0;
  local_c8.data = (void *)0x0;
  lrtr_ip_str_to_addr("132.200.0.0",&local_c8.prefix);
  trie_insert(&local_88,&local_c8,0);
  lrtr_ip_str_to_addr("132.200.0.0",&local_48);
  local_14c = 0;
  ptVar2 = trie_lookup(&local_88,&local_48,'\x10',&local_14c);
  if (ptVar2 == (trie_node *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x47,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&ptVar2->prefix,"132.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&result->prefix, \"132.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x48,"void trie_test(void)");
  }
  if (local_88.rchild != &local_c8) {
    __assert_fail("n1.rchild == &n2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x49,"void trie_test(void)");
  }
  local_108.len = '\x10';
  local_108.rchild = (trie_node *)0x0;
  local_108.lchild = (trie_node *)0x0;
  local_108.parent = (trie_node *)0x0;
  local_108.data = (void *)0x0;
  lrtr_ip_str_to_addr("101.200.0.0",&local_108.prefix);
  trie_insert(&local_88,&local_108,0);
  lrtr_ip_str_to_addr("101.200.0.0",&local_48);
  local_14c = 0;
  ptVar2 = trie_lookup(&local_88,&local_48,'\x10',&local_14c);
  if (ptVar2 == (trie_node *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x5c,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&ptVar2->prefix,"101.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&result->prefix, \"101.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x5d,"void trie_test(void)");
  }
  if (local_88.lchild != &local_108) {
    __assert_fail("n1.lchild == &n3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x5e,"void trie_test(void)");
  }
  local_148.len = '\x18';
  local_148.rchild = (trie_node *)0x0;
  local_148.lchild = (trie_node *)0x0;
  local_148.parent = (trie_node *)0x0;
  local_148.data = (void *)0x0;
  lrtr_ip_str_to_addr("132.201.3.0",&local_148.prefix);
  trie_insert(&local_88,&local_148,0);
  lrtr_ip_str_to_addr("132.201.3.0",&local_48);
  local_14c = 0;
  ptVar2 = trie_lookup(&local_88,&local_48,'\x18',&local_14c);
  if (ptVar2 == (trie_node *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x73,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&ptVar2->prefix,"132.201.3.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&result->prefix, \"132.201.3.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x74,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&local_88.prefix,"100.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&n1.prefix, \"100.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x76,"void trie_test(void)");
  }
  if (local_88.len != '\x10') {
    __assert_fail("n1.len == 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x77,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&(local_88.lchild)->prefix,"101.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&n1.lchild->prefix, \"101.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x7a,"void trie_test(void)");
  }
  if ((local_88.lchild)->len != '\x10') {
    __assert_fail("n1.lchild->len == 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x7b,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&(local_88.rchild)->prefix,"132.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&n1.rchild->prefix, \"132.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x7d,"void trie_test(void)");
  }
  if ((local_88.rchild)->len != '\x10') {
    __assert_fail("n1.rchild->len == 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x7e,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&(local_88.rchild)->lchild->prefix,"132.201.3.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&n1.rchild->lchild->prefix, \"132.201.3.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x80,"void trie_test(void)");
  }
  if ((local_88.rchild)->lchild->len != '\x18') {
    __assert_fail("n1.rchild->lchild->len == 24",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x81,"void trie_test(void)");
  }
  lrtr_ip_str_to_addr("132.200.0.0",&local_48);
  local_14c = 0;
  ptVar2 = trie_lookup(&local_88,&local_48,'\x10',&local_14c);
  if (ptVar2 == (trie_node *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x86,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&ptVar2->prefix,"132.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&result->prefix, \"132.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x87,"void trie_test(void)");
  }
  lrtr_ip_str_to_addr("132.200.3.0",&local_48);
  local_14c = 0;
  ptVar2 = trie_lookup(&local_88,&local_48,'\x10',&local_14c);
  if (ptVar2 == (trie_node *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x8d,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&ptVar2->prefix,"132.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&result->prefix, \"132.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x8e,"void trie_test(void)");
  }
  local_14c = 0;
  lrtr_ip_str_to_addr("132.0.0.0",&local_48);
  trie_lookup_exact(&local_88,&local_48,'\x10',&local_14c,&local_14d);
  if (local_14d == true) {
    __assert_fail("!found",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x94,"void trie_test(void)");
  }
  local_14c = 0;
  lrtr_ip_str_to_addr("132.201.3.0",&local_48);
  ptVar2 = trie_lookup_exact(&local_88,&local_48,'\x18',&local_14c,&local_14d);
  if (local_14d == false) {
    __assert_fail("found",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x9a,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&ptVar2->prefix,"132.201.3.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&result->prefix, \"132.201.3.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0x9b,"void trie_test(void)");
  }
  lrtr_ip_str_to_addr("132.200.0.0",&local_48);
  ptVar2 = trie_remove(&local_88,&local_48,'\x10',0);
  if (ptVar2 == (trie_node *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0xa5,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&local_88.prefix,"100.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&n1.prefix, \"100.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0xa6,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&(local_88.lchild)->prefix,"101.200.0.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&n1.lchild->prefix, \"101.200.0.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0xa7,"void trie_test(void)");
  }
  _Var1 = lrtr_ip_str_cmp(&(local_88.rchild)->prefix,"132.201.3.0");
  if (!_Var1) {
    __assert_fail("lrtr_ip_str_cmp(&n1.rchild->prefix, \"132.201.3.0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                  ,0xa8,"void trie_test(void)");
  }
  if ((local_88.rchild)->lchild == (trie_node *)0x0) {
    lrtr_ip_str_to_addr("101.200.0.0",&local_48);
    ptVar2 = trie_remove(&local_88,&local_48,'\x10',0);
    if (ptVar2 == (trie_node *)0x0) {
      __assert_fail("result",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                    ,0xb3,"void trie_test(void)");
    }
    _Var1 = lrtr_ip_str_cmp(&(local_88.rchild)->prefix,"132.201.3.0");
    if (!_Var1) {
      __assert_fail("lrtr_ip_str_cmp(&n1.rchild->prefix, \"132.201.3.0\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                    ,0xb4,"void trie_test(void)");
    }
    if (local_88.lchild != (trie_node *)0x0) {
      __assert_fail("!n1.lchild",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                    ,0xb5,"void trie_test(void)");
    }
    lrtr_ip_str_to_addr("100.200.0.0",&local_48);
    ptVar2 = trie_remove(&local_88,&local_48,'\x10',0);
    _Var1 = lrtr_ip_str_cmp(&local_88.prefix,"132.201.3.0");
    if (!_Var1) {
      __assert_fail("lrtr_ip_str_cmp(&n1.prefix, \"132.201.3.0\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                    ,0xbd,"void trie_test(void)");
    }
    if (ptVar2 == (trie_node *)0x0) {
      __assert_fail("result",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                    ,0xbe,"void trie_test(void)");
    }
    if (local_88.lchild != (trie_node *)0x0) {
      __assert_fail("!n1.lchild",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                    ,0xbf,"void trie_test(void)");
    }
    if (local_88.rchild != (trie_node *)0x0) {
      __assert_fail("!n1.rchild",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                    ,0xc0,"void trie_test(void)");
    }
    puts("Test successful");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return 0;
    }
    __stack_chk_fail();
  }
  __assert_fail("!n1.rchild->lchild",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_trie.c"
                ,0xa9,"void trie_test(void)");
}

Assistant:

int main(void)
{
	trie_test();
	printf("Test successful\n");
	return EXIT_SUCCESS;
}